

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O1

Edge __thiscall geometrycentral::surface::SurfaceMesh::getNewEdge(SurfaceMesh *this)

{
  size_t sVar1;
  long lVar2;
  logic_error *this_00;
  _List_node_base *p_Var3;
  size_type __new_size;
  Edge EVar4;
  size_type local_30;
  
  if (this->useImplicitTwinFlag == true) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    ::std::logic_error::logic_error
              (this_00,"cannot construct a single new edge with implicit twin convention");
    __cxa_throw(this_00,&::std::logic_error::typeinfo,::std::logic_error::~logic_error);
  }
  if (this->nEdgesCapacityCount <= this->nEdgesFillCount) {
    lVar2 = this->nEdgesCapacityCount * 2;
    __new_size = lVar2 + (ulong)(lVar2 == 0);
    this->nEdgesCapacityCount = __new_size;
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&this->eHalfedgeArr,__new_size);
    p_Var3 = (this->edgeExpandCallbackList).
             super__List_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var3 != (_List_node_base *)&this->edgeExpandCallbackList) {
      do {
        local_30 = __new_size;
        if (p_Var3[2]._M_next == (_List_node_base *)0x0) {
          ::std::__throw_bad_function_call();
        }
        (*(code *)p_Var3[2]._M_prev)(p_Var3 + 1,&local_30);
        p_Var3 = p_Var3->_M_next;
      } while (p_Var3 != (_List_node_base *)&this->edgeExpandCallbackList);
    }
  }
  sVar1 = this->nEdgesFillCount;
  this->nEdgesFillCount = sVar1 + 1;
  this->nEdgesCount = this->nEdgesCount + 1;
  this->modificationTick = this->modificationTick + 1;
  this->isCompressedFlag = false;
  EVar4.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
       sVar1;
  EVar4.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
       this;
  return (Edge)EVar4.
               super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>;
}

Assistant:

Edge SurfaceMesh::getNewEdge() {

  if (usesImplicitTwin()) {
    throw std::logic_error("cannot construct a single new edge with implicit twin convention");
  }

  // The boring case, when no resize is needed
  if (nEdgesFillCount < nEdgesCapacityCount) {
    // No work needed
  }
  // The intesting case, where vectors resize
  else {
    size_t newEdgeCapacity = std::max(nEdgesCapacityCount * 2, (size_t)1);

    nEdgesCapacityCount = newEdgeCapacity;

    if (!usesImplicitTwin()) { // must enter this case, see test above
      eHalfedgeArr.resize(newEdgeCapacity);
    }

    // Invoke relevant callback functions
    for (auto& f : edgeExpandCallbackList) {
      f(newEdgeCapacity);
    }
  }

  nEdgesFillCount++;
  nEdgesCount++;

  modificationTick++;
  isCompressedFlag = false;
  return Edge(this, nEdgesFillCount - 1);
}